

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

void __thiscall
Omega_h::CmdLineFlag::add_arg<std::__cxx11::string>
          (CmdLineFlag *this,string *arg_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defval)

{
  CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  unique_ptr<Omega_h::CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Omega_h::CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defval_local;
  string *arg_name_local;
  CmdLineFlag *this_local;
  
  local_20 = defval;
  defval_local = arg_name;
  arg_name_local = (string *)this;
  this_00 = (CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x50);
  CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CmdLineArg(this_00,defval_local,local_20);
  std::
  unique_ptr<Omega_h::CmdLineArg<std::__cxx11::string>,std::default_delete<Omega_h::CmdLineArg<std::__cxx11::string>>>
  ::unique_ptr<std::default_delete<Omega_h::CmdLineArg<std::__cxx11::string>>,void>
            ((unique_ptr<Omega_h::CmdLineArg<std::__cxx11::string>,std::default_delete<Omega_h::CmdLineArg<std::__cxx11::string>>>
              *)&local_30,this_00);
  std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>::
  unique_ptr<Omega_h::CmdLineArg<std::__cxx11::string>,std::default_delete<Omega_h::CmdLineArg<std::__cxx11::string>>,void>
            ((unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>> *)&local_28
             ,&local_30);
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  ::push_back(&this->args_,(value_type *)&local_28);
  std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::~unique_ptr
            (&local_28);
  std::
  unique_ptr<Omega_h::CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Omega_h::CmdLineArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_30);
  return;
}

Assistant:

void CmdLineFlag::add_arg(std::string const& arg_name, T const& defval) {
  args_.push_back(
      std::unique_ptr<CmdLineArg<T>>(new CmdLineArg<T>(arg_name, defval)));
}